

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasinterval.cpp
# Opt level: O0

BOOL __thiscall LASinterval::has_intervals(LASinterval *this)

{
  bool bVar1;
  LASinterval *this_local;
  
  bVar1 = this->current_cell != (LASintervalCell *)0x0;
  if (bVar1) {
    this->start = this->current_cell->start;
    this->end = this->current_cell->end;
    this->current_cell = this->current_cell->next;
  }
  return bVar1;
}

Assistant:

BOOL LASinterval::has_intervals()
{
  if (current_cell)
  {
    start = current_cell->start;
    end = current_cell->end;
    current_cell = current_cell->next;
    return TRUE;
  }
  return FALSE;
}